

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

uint32_t vkb::detail::get_separate_queue_index
                   (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    *families,VkQueueFlags desired_flags,VkQueueFlags undesired_flags)

{
  size_type sVar1;
  const_reference pvVar2;
  uint local_28;
  uint32_t local_24;
  uint32_t i;
  uint32_t index;
  VkQueueFlags undesired_flags_local;
  VkQueueFlags desired_flags_local;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *families_local;
  
  local_24 = 0xffffffff;
  local_28 = 0;
  do {
    sVar1 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::size
                      (families);
    if ((uint)sVar1 <= local_28) {
      return local_24;
    }
    pvVar2 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
             operator[](families,(ulong)local_28);
    if (((pvVar2->queueFlags & desired_flags) == desired_flags) &&
       (pvVar2 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
                 operator[](families,(ulong)local_28), (pvVar2->queueFlags & 1) == 0)) {
      pvVar2 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
               operator[](families,(ulong)local_28);
      if ((pvVar2->queueFlags & undesired_flags) == 0) {
        return local_28;
      }
      local_24 = local_28;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

uint32_t get_separate_queue_index(
    std::vector<VkQueueFamilyProperties> const& families, VkQueueFlags desired_flags, VkQueueFlags undesired_flags) {
    uint32_t index = QUEUE_INDEX_MAX_VALUE;
    for (uint32_t i = 0; i < static_cast<uint32_t>(families.size()); i++) {
        if ((families[i].queueFlags & desired_flags) == desired_flags && ((families[i].queueFlags & VK_QUEUE_GRAPHICS_BIT) == 0)) {
            if ((families[i].queueFlags & undesired_flags) == 0) {
                return i;
            } else {
                index = i;
            }
        }
    }
    return index;
}